

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

int64_t __thiscall
aeron::ClientConductor::addCounter
          (ClientConductor *this,int32_t typeId,uint8_t *keyBuffer,size_t keyLength,string *label)

{
  int64_t iVar1;
  IllegalArgumentException *pIVar2;
  char *pcVar3;
  allocator local_b2;
  allocator local_b1;
  int64_t registrationId;
  string local_90;
  string local_70;
  string local_50;
  
  verifyDriverIsActive(this);
  ensureOpen(this);
  if (0x70 < keyLength) {
    pIVar2 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_90,keyLength);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &registrationId,"key length out of bounds: ",&local_90);
    std::__cxx11::string::string
              ((string *)&local_50,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,&local_b1);
    pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                              );
    std::__cxx11::string::string((string *)&local_70,pcVar3,&local_b2);
    util::IllegalArgumentException::IllegalArgumentException
              (pIVar2,(string *)&registrationId,&local_50,&local_70,0x142);
    __cxa_throw(pIVar2,&util::IllegalArgumentException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if (label->_M_string_length < 0x17d) {
    std::recursive_mutex::lock(&this->m_adminLock);
    registrationId = DriverProxy::addCounter(this->m_driverProxy,typeId,keyBuffer,keyLength,label);
    local_90._M_dataplus._M_p =
         (pointer)std::function<long_long_()>::operator()(&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
    ::emplace_back<long&,long_long>
              ((vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
                *)&this->m_counters,&registrationId,(longlong *)&local_90);
    iVar1 = registrationId;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
    return iVar1;
  }
  pIVar2 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_90,label->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &registrationId,"label length out of bounds: ",&local_90);
  std::__cxx11::string::string
            ((string *)&local_50,
             "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
             ,&local_b1);
  pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                            );
  std::__cxx11::string::string((string *)&local_70,pcVar3,&local_b2);
  util::IllegalArgumentException::IllegalArgumentException
            (pIVar2,(string *)&registrationId,&local_50,&local_70,0x147);
  __cxa_throw(pIVar2,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t ClientConductor::addCounter(
    std::int32_t typeId, const std::uint8_t *keyBuffer, std::size_t keyLength, const std::string& label)
{
    verifyDriverIsActive();
    ensureOpen();

    if (keyLength > CountersManager::MAX_KEY_LENGTH)
    {
        throw IllegalArgumentException("key length out of bounds: " + std::to_string(keyLength), SOURCEINFO);
    }

    if (label.length() > CountersManager::MAX_LABEL_LENGTH)
    {
        throw IllegalArgumentException("label length out of bounds: " + std::to_string(label.length()), SOURCEINFO);
    }

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addCounter(typeId, keyBuffer, keyLength, label);

    m_counters.emplace_back(registrationId, m_epochClock());

    return registrationId;
}